

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O3

vec<float,_4> linalg::slerp<float,4>(vec<float,_4> *a,vec<float,_4> *b,float t)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar11;
  float fVar9;
  float fVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  vec<float,_4> vVar16;
  float local_68;
  float fStack_64;
  float local_28;
  float fStack_24;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  
  fVar1 = uangle<float,4>(a,b);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar4 = sinf((1.0 - t) * fVar1);
    fVar9 = sinf(fVar1);
    uVar7 = a->x;
    uVar8 = a->y;
    uVar2 = a->z;
    uVar5 = a->w;
    fVar10 = sinf(fVar1 * t);
    fVar1 = sinf(fVar1);
    auVar13._4_4_ = extraout_XMM0_Db;
    auVar13._0_4_ = fVar4;
    auVar13._8_4_ = extraout_XMM0_Db;
    auVar13._12_4_ = extraout_XMM0_Dd;
    auVar12._8_8_ = auVar13._8_8_;
    auVar12._4_4_ = fVar10;
    auVar12._0_4_ = fVar4;
    auVar14._0_12_ = auVar12._0_12_;
    auVar14._12_4_ = extraout_XMM0_Db_01;
    auVar15._4_4_ = fVar1;
    auVar15._0_4_ = fVar9;
    auVar15._8_4_ = extraout_XMM0_Db_00;
    auVar15._12_4_ = extraout_XMM0_Db_02;
    auVar15 = divps(auVar14,auVar15);
    fVar4 = auVar15._0_4_;
    fVar9 = auVar15._4_4_;
    uVar3 = b->z;
    uVar6 = b->w;
    uVar11 = CONCAT44(fVar9 * (float)uVar6 + fVar4 * (float)uVar5,
                      fVar9 * (float)uVar3 + fVar4 * (float)uVar2);
    fVar1 = b->x * fVar9 + (float)uVar7 * fVar4;
    fVar4 = b->y * fVar9 + (float)uVar8 * fVar4;
  }
  else {
    fVar1 = a->x;
    fVar4 = a->y;
    uVar11._0_4_ = a->z;
    uVar11._4_4_ = a->w;
  }
  vVar16.y = fVar4;
  vVar16.x = fVar1;
  vVar16.z = (float)(int)uVar11;
  vVar16.w = (float)(int)((ulong)uVar11 >> 0x20);
  return vVar16;
}

Assistant:

vec<T,M>    nlerp    (const vec<T,M> & a, const vec<T,M> & b, T t) { return normalize(lerp(a,b,t)); }